

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig_block.c
# Opt level: O0

void sig_unblock(int sig)

{
  undefined1 local_90 [8];
  sigset_t ss;
  int sig_local;
  
  ss.__val[0xf]._4_4_ = sig;
  sigemptyset((sigset_t *)local_90);
  sigaddset((sigset_t *)local_90,ss.__val[0xf]._4_4_);
  sigprocmask(1,(sigset_t *)local_90,(sigset_t *)0x0);
  return;
}

Assistant:

void sig_unblock(int sig)
{
#ifdef HASSIGPROCMASK
  sigset_t ss;
  sigemptyset(&ss);
  sigaddset(&ss,sig);
  sigprocmask(SIG_UNBLOCK,&ss,(sigset_t *) 0);
#else
  sigsetmask(sigsetmask(~0) & ~(1 << (sig - 1)));
#endif
}